

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npp.cpp
# Opt level: O3

bool __thiscall pg::NPPSolver::atronsubgameup(NPPSolver *this)

{
  ulong *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *plVar6;
  _List_node_base *p_Var7;
  uint64_t *puVar8;
  uint64_t *puVar9;
  uint *puVar10;
  uint *puVar11;
  uint64_t *puVar12;
  Game *pGVar13;
  bitset *pbVar14;
  ulong uVar15;
  ulong uVar16;
  int *piVar17;
  uint *puVar18;
  bitset *pbVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  _List_node_base *p_Var24;
  int iVar25;
  _List_node_base *p_Var26;
  _List_node_base *p_Var27;
  int *piVar28;
  ulong uVar29;
  uint local_8c;
  list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *local_88;
  int *local_80;
  bitset *local_78;
  Game *local_70;
  deque<unsigned_int,_std::allocator<unsigned_int>_> *local_68;
  uint64_t *local_60;
  bitset *local_58;
  pointer local_50;
  list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *local_48;
  pointer local_40;
  uint *local_38;
  
  local_48 = (this->Entries).
             super__Vector_base<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*,_std::allocator<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_start[this->Pivot];
  plVar6 = *(list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             **)&(local_48->
                 super__List_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 )._M_impl._M_node;
  if (plVar6 != local_48) {
    local_50 = (this->Supgame).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    local_58 = local_50[this->Top];
    do {
      local_88 = plVar6;
      p_Var24 = *(_List_node_base **)
                 ((long)&local_88[1].
                         super__List_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl._M_node + 8);
      p_Var7 = *(_List_node_base **)
                ((long)&local_88[2].
                        super__List_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl._M_node + 0x10);
      if (p_Var24 != p_Var7) {
        local_70 = (this->super_Solver).game;
        puVar8 = (this->R)._bits;
        puVar9 = (this->outgame)._bits;
        local_60 = local_58->_bits;
        local_80 = this->strategy;
        local_40 = (this->Exits).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        p_Var27 = *(_List_node_base **)
                   &local_88[2].
                    super__List_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl._M_node;
        p_Var26 = *(_List_node_base **)
                   ((long)&local_88[2].
                           super__List_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl._M_node + 8);
        puVar10 = (this->E).queue;
        local_38 = (this->T).queue;
        do {
          uVar2 = *(uint *)&p_Var24->_M_next;
          uVar20 = (ulong)(int)uVar2;
          this->pos = uVar2;
          uVar15 = uVar20 >> 6;
          if (((local_60[uVar15] >> (uVar20 & 0x3f) & 1) == 0) &&
             (uVar16 = 1L << (uVar20 & 0x3f), (puVar8[uVar15] & uVar16) == 0)) {
            if (this->alpha == (uint)(((local_70->_owner)._bits[uVar15] & uVar16) != 0)) {
              iVar25 = local_70->_outedges[local_70->_firstouts[uVar20]];
              if (iVar25 != -1) {
                piVar17 = local_70->_outedges + (long)local_70->_firstouts[uVar20] + 1;
                do {
                  if ((puVar8[(ulong)(long)iVar25 >> 6] >> ((long)iVar25 & 0x3fU) & 1) != 0) {
                    if (((puVar8[uVar2 >> 6] >> (uVar20 & 0x3f) & 1) != 0) &&
                       (local_80[uVar2] != -1)) {
                      iVar25 = local_80[uVar2];
                    }
                    goto LAB_0014fbd9;
                  }
                  iVar25 = *piVar17;
                  piVar17 = piVar17 + 1;
                } while (iVar25 != -1);
              }
            }
            else {
              uVar3 = local_70->_outedges[local_70->_firstouts[uVar20]];
              if (uVar3 != 0xffffffff) {
                puVar18 = (uint *)(local_70->_outedges + (long)local_70->_firstouts[uVar20] + 1);
                pbVar19 = local_50[this->Top];
                puVar11 = (this->E).queue;
                do {
                  uVar15 = (ulong)(long)(int)uVar3 >> 6;
                  if (((puVar9[uVar15] >> ((ulong)uVar3 & 0x3f) & 1) == 0) &&
                     (uVar20 = 1L << ((ulong)uVar3 & 0x3f), (puVar8[uVar15] & uVar20) == 0)) {
                    if ((pbVar19->_bits[uVar15] & uVar20) == 0) {
                      (this->E).pointer = 0;
                      goto LAB_0014fc11;
                    }
                    iVar25 = (this->E).pointer;
                    (this->E).pointer = iVar25 + 1;
                    puVar11[iVar25] = uVar3;
                  }
                  uVar3 = *puVar18;
                  puVar18 = puVar18 + 1;
                } while (uVar3 != 0xffffffff);
              }
              iVar25 = (this->E).pointer;
              lVar23 = (long)iVar25;
              if (lVar23 != 0) {
                puVar12 = local_40[this->Pivot]->_bits;
                do {
                  iVar25 = iVar25 + -1;
                  (this->E).pointer = iVar25;
                  uVar3 = puVar10[lVar23 + -1];
                  puVar12[uVar3 >> 6] = puVar12[uVar3 >> 6] | 1L << ((ulong)uVar3 & 0x3f);
                  lVar23 = lVar23 + -1;
                } while (lVar23 != 0);
              }
              iVar25 = -1;
LAB_0014fbd9:
              local_80[uVar2] = iVar25;
              uVar4 = this->pos;
              puVar8[(ulong)(long)(int)uVar4 >> 6] =
                   puVar8[(ulong)(long)(int)uVar4 >> 6] | 1L << ((long)(int)uVar4 & 0x3fU);
              iVar25 = (this->T).pointer;
              (this->T).pointer = iVar25 + 1;
              local_38[iVar25] = uVar4;
            }
          }
LAB_0014fc11:
          p_Var24 = (_List_node_base *)((long)&p_Var24->_M_next + 4);
          if (p_Var24 == p_Var27) {
            p_Var24 = p_Var26->_M_prev;
            p_Var26 = (_List_node_base *)&p_Var26->_M_prev;
            p_Var27 = p_Var24 + 0x20;
          }
        } while (p_Var24 != p_Var7);
      }
      plVar6 = *(list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 **)&(local_88->
                     super__List_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     )._M_impl._M_node;
    } while (plVar6 != local_48);
  }
  iVar25 = (this->T).pointer;
  local_88 = (list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)CONCAT44(local_88._4_4_,iVar25);
  do {
    do {
      if (iVar25 == 0) {
        return (int)local_88 != 0;
      }
      (this->T).pointer = iVar25 + -1;
      pGVar13 = (this->super_Solver).game;
      uVar4 = (this->T).queue[(long)iVar25 + -1];
      piVar28 = (int *)(long)(int)uVar4;
      piVar17 = pGVar13->_inedges;
      iVar5 = pGVar13->_firstins[(long)piVar28];
      local_8c = piVar17[iVar5];
      iVar25 = iVar25 + -1;
    } while (local_8c == 0xffffffff);
    piVar17 = piVar17 + iVar5;
    pbVar19 = (this->Supgame).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>.
              _M_impl.super__Vector_impl_data._M_start[this->Top];
    local_68 = (deque<unsigned_int,_std::allocator<unsigned_int>_> *)
               (*(long *)&((this->Entries).
                           super__Vector_base<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*,_std::allocator<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[this->Pivot]->
                          super__List_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )._M_impl._M_node + 0x10);
    local_78 = pbVar19;
    do {
      uVar15 = (ulong)local_8c;
      puVar8 = (this->outgame)._bits;
      uVar16 = (ulong)(int)local_8c;
      uVar20 = uVar16 >> 6;
      if ((puVar8[uVar20] >> (uVar15 & 0x3f) & 1) == 0) {
        puVar9 = (this->R)._bits;
        uVar21 = 1L << (uVar15 & 0x3f);
        uVar22 = puVar9[uVar20];
        if ((uVar22 & uVar21) == 0) {
          if ((pbVar19->_bits[uVar20] & uVar21) == 0) {
            pGVar13 = (this->super_Solver).game;
            pbVar19 = local_78;
            if (this->alpha == (uint)(((pGVar13->_owner)._bits[uVar20] & uVar21) != 0)) {
              puVar9[uVar20] = uVar22 | uVar21;
              this->strategy[uVar16] = uVar4;
            }
            else {
              uVar2 = pGVar13->_outedges[pGVar13->_firstouts[uVar16]];
              local_80 = piVar28;
              if (uVar2 != 0xffffffff) {
                local_70 = (Game *)(this->E).queue;
                puVar18 = (uint *)(pGVar13->_outedges + (long)pGVar13->_firstouts[uVar16] + 1);
                pbVar14 = (this->Supgame).
                          super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl.
                          super__Vector_impl_data._M_start[this->Top];
                do {
                  uVar16 = (ulong)(long)(int)uVar2 >> 6;
                  if (((puVar8[uVar16] >> ((ulong)uVar2 & 0x3f) & 1) == 0) &&
                     (uVar29 = 1L << ((ulong)uVar2 & 0x3f), (puVar9[uVar16] & uVar29) == 0)) {
                    if ((pbVar14->_bits[uVar16] & uVar29) == 0) {
                      (this->E).pointer = 0;
                      goto LAB_0014feae;
                    }
                    iVar25 = (this->E).pointer;
                    (this->E).pointer = iVar25 + 1;
                    *(uint *)((long)&local_70->n_vertices + (long)iVar25 * 4) = uVar2;
                  }
                  uVar2 = *puVar18;
                  puVar18 = puVar18 + 1;
                } while (uVar2 != 0xffffffff);
              }
              iVar25 = (this->E).pointer;
              lVar23 = (long)iVar25;
              if (lVar23 != 0) {
                puVar10 = (this->E).queue;
                puVar8 = (this->Exits).
                         super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl.
                         super__Vector_impl_data._M_start[this->Pivot]->_bits;
                do {
                  iVar25 = iVar25 + -1;
                  (this->E).pointer = iVar25;
                  uVar2 = puVar10[lVar23 + -1];
                  puVar1 = puVar8 + (uVar2 >> 6);
                  *puVar1 = *puVar1 | 1L << ((ulong)uVar2 & 0x3f);
                  lVar23 = lVar23 + -1;
                } while (lVar23 != 0);
                uVar22 = puVar9[uVar20];
              }
              this->strategy[uVar15] = -1;
              puVar9[uVar20] = uVar22 | uVar21;
            }
            iVar25 = (this->T).pointer;
            (this->T).pointer = iVar25 + 1;
            (this->T).queue[iVar25] = local_8c;
          }
          else {
            std::deque<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      (local_68,&local_8c);
          }
        }
      }
LAB_0014feae:
      local_8c = piVar17[1];
      piVar17 = piVar17 + 1;
    } while (local_8c != 0xffffffff);
    iVar25 = (this->T).pointer;
  } while( true );
}

Assistant:

bool NPPSolver::atronsubgameup()
{
    auto & supgame = *(Supgame[Top]);
    auto & entries = *(Entries[Pivot]);
    auto lend = entries.end();
    for (auto liter = entries.begin(); liter != lend; ++liter)
    {
        auto & rdeque = *liter;
        auto dend = rdeque.end();
        for (auto diter = rdeque.begin(); diter != dend; ++diter)
        {
            pos = *diter;
            if (!supgame[pos] && !R[pos] && isclosedonsubgame(pos))
            {
                R[pos] = true;
                T.push(pos);
            }
        }
    }
    if (T.nonempty())
    {
        do
        {
            pushinqueueonsubgameup(T.pop());
        }
        while (T.nonempty());
        return (true);
    }
    else
    {
        return (false);
    }
}